

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateAddAlias(HelicsFederate fed,char *interfaceName,char *alias,HelicsError *err)

{
  Federate *this;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  string_view interfaceName_00;
  string_view alias_00;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    return;
  }
  if ((interfaceName == (char *)0x0) || (*interfaceName == '\0')) {
    if (err == (HelicsError *)0x0) {
      return;
    }
    err->error_code = -4;
    pcVar3 = "Interface name cannot be empty";
  }
  else {
    if ((alias != (char *)0x0) && (*alias != '\0')) {
      sVar1 = strlen(interfaceName);
      sVar2 = strlen(alias);
      interfaceName_00._M_str = interfaceName;
      interfaceName_00._M_len = sVar1;
      alias_00._M_str = alias;
      alias_00._M_len = sVar2;
      helics::Federate::addAlias(this,interfaceName_00,alias_00);
      return;
    }
    if (err == (HelicsError *)0x0) {
      return;
    }
    err->error_code = -4;
    pcVar3 = "Alias cannot be empty";
  }
  err->message = pcVar3;
  return;
}

Assistant:

void helicsFederateAddAlias(HelicsFederate fed, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        fedObj->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}